

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_key.c
# Opt level: O0

void get_str(char **pt,char *kvalue,unsigned_long *stat)

{
  char *pcVar1;
  ushort **ppuVar2;
  char *pcVar3;
  bool bVar4;
  char *local_38;
  char *p;
  int nchar;
  char prev;
  char *pi;
  unsigned_long *stat_local;
  char *kvalue_local;
  char **pt_local;
  
  pcVar3 = *pt;
  p._7_1_ = 'a';
  pcVar1 = pcVar3;
  while (local_38 = pcVar1 + 1, *local_38 != '\0') {
    ppuVar2 = __ctype_b_loc();
    if (((*ppuVar2)[(int)*local_38] & 0x4000) == 0) {
      *stat = *stat | 1;
    }
    if ((p._7_1_ == '\'') && (*local_38 != '\'')) break;
    pcVar1 = local_38;
    if ((p._7_1_ == '\'') && (*local_38 == '\'')) {
      p._7_1_ = 'a';
    }
    else {
      p._7_1_ = *local_38;
    }
  }
  if (*pcVar1 != '\'') {
    *stat = *stat | 2;
  }
  pcVar3 = pcVar3 + 1;
  p._0_4_ = (int)pcVar1 - (int)pcVar3;
  if ((int)p < 0) {
    p._0_4_ = 0;
  }
  strncpy(kvalue,pcVar3,(long)(int)p);
  kvalue[(int)p] = '\0';
  _nchar = kvalue + ((int)p + -1);
  while( true ) {
    bVar4 = false;
    if (kvalue <= _nchar) {
      ppuVar2 = __ctype_b_loc();
      bVar4 = ((*ppuVar2)[(int)*_nchar] & 0x2000) != 0;
    }
    if (!bVar4) break;
    *_nchar = '\0';
    _nchar = _nchar + -1;
  }
  while( true ) {
    ppuVar2 = __ctype_b_loc();
    bVar4 = false;
    if (((*ppuVar2)[(int)*local_38] & 0x2000) != 0) {
      bVar4 = *local_38 != '\0';
    }
    if (!bVar4) break;
    local_38 = local_38 + 1;
  }
  *pt = local_38;
  return;
}

Assistant:

void get_str(char **pt,     		/* card string from character 11*/
	    char *kvalue,		/* key value string */
	    unsigned long *stat		/* error number */
	   )
{    
    char *pi;
    char prev;		/* previous char */
    int nchar = 0;
    char *p;
  
    p = *pt;
    pi = p;
    p++;
    prev = 'a';
    while(*p != '\0') { 
        if( !isprint((int)*p) )*stat |= BAD_STR;
	if(prev == '\'' && *p != '\'') break;
	if(prev == '\'' && *p == '\'') {    /* skip the '' */
	    p++;
	    prev = 'a';
        } 
	else {
            prev = *p;
            p++;
        }
    }
    p--;
    if(*p != '\'') *stat |= NO_TRAIL_QUOTE; 
    pi++;	    
    nchar = p - pi ;     /* excluding the ' */
    if (nchar < 0) nchar = 0; 
    strncpy(kvalue,pi,(size_t)nchar);
    *(kvalue+nchar) = '\0'; 
    pi = kvalue + (nchar -1) ; 
    while(pi >= kvalue && isspace((int)*pi)){ *pi = '\0'; pi--;} /* delete the trailing space */ 
    p++;				  /* skip the  ' */
    while(isspace((int)*p) && *p != '\0')  p++; 
    *pt = p;
    return;
}